

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap_log.c
# Opt level: O3

void ap_log(AP_LOG_LEVEL level,char *format,...)

{
  char in_AL;
  tm *__tp;
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *src;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  time_t t;
  va_list args;
  time_t local_100 [2];
  time_t *local_f0;
  undefined1 *local_e8;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  if ((format != (char *)0x0) && (level <= ap_log_level)) {
    local_c8 = in_RDX;
    local_c0 = in_RCX;
    local_b8 = in_R8;
    local_b0 = in_R9;
    local_100[0] = time((time_t *)0x0);
    if (local_100[0] != -1) {
      __tp = localtime(local_100);
      if (__tp != (tm *)0x0) {
        sVar1 = strftime(ap_log_buf,0x1000,"%Y/%m/%d %H:%M:%S",__tp);
        if (sVar1 == 0) {
          ap_str_strlcpy(ap_log_buf,"strftime error",0x1000);
        }
      }
    }
    ap_str_strlcat(ap_log_buf," [",0x1000);
    if (level < (AP_LOG_LEVEL_DEBUG|AP_LOG_LEVEL_DENIED_COMMAND)) {
      src = &DAT_001049e0 + *(int *)(&DAT_001049e0 + (ulong)level * 4);
    }
    else {
      src = "unknown log level";
    }
    ap_str_strlcat(ap_log_buf,src,0x1000);
    ap_str_strlcat(ap_log_buf,"] ",0x1000);
    local_100[1] = 0x3000000010;
    local_f0 = &t;
    local_e8 = local_d8;
    sVar1 = strlen(ap_log_buf);
    vsnprintf(ap_log_buf + sVar1,0x1000 - sVar1,format,local_100 + 1);
    fputs(ap_log_buf,(FILE *)ap_log_file);
    fflush((FILE *)ap_log_file);
  }
  return;
}

Assistant:

void ap_log (AP_LOG_LEVEL level, const char *format, ...)
{
	time_t		t;
	struct tm	*tm					= NULL;
	size_t		size;
	size_t		log_buf_size		= sizeof (ap_log_buf);
	va_list		args;
	size_t		log_buf_len			= 0;

	if (format == NULL)
	{
		goto finish;
	}

	if (level > ap_log_level)
	{
		goto finish;
	}

	t = time (NULL);
	if (t != (time_t) -1)
	{
		tm = localtime (&t);
		if (tm != NULL)
		{
			size = strftime (ap_log_buf, log_buf_size, AP_LOG_TIME_FORMAT, tm);
			if (size == 0)
			{
				ap_str_strlcpy (ap_log_buf, "strftime error", log_buf_size);
			}
		}
	}

	ap_str_strlcat (ap_log_buf, " [", log_buf_size);
	ap_str_strlcat (ap_log_buf, level_to_str (level), log_buf_size);
	ap_str_strlcat (ap_log_buf, "] ", log_buf_size);

	va_start (args, format);

	log_buf_len = strlen (ap_log_buf);
	vsnprintf (ap_log_buf + log_buf_len, log_buf_size - log_buf_len, format, args);

	va_end (args);

	fprintf (ap_log_file, "%s", ap_log_buf);

	fflush (ap_log_file);

finish:
	return;
}